

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Converter.cpp
# Opt level: O0

string * __thiscall
(anonymous_namespace)::
from_utf_nn<unsigned_short,convertUTF::ConversionResult(*)(unsigned_short_const**,unsigned_short_const*,unsigned_char**,unsigned_char_const*,convertUTF::ConversionFlags)>
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *vec,
          _func_ConversionResult_unsigned_short_ptr_ptr_unsigned_short_ptr_uchar_ptr_ptr_uchar_ptr_ConversionFlags
          *conversionFn)

{
  int iVar1;
  unsigned_short *puVar2;
  size_type sVar3;
  UTF8 *pUVar4;
  long lVar5;
  VodCoreException *this_00;
  string local_200;
  ostringstream local_1e0 [8];
  ostringstream ss;
  ConversionResult result;
  UTF8 *targetEnd;
  UTF8 *targetStart_out;
  UTF8 *targetStart;
  unsigned_short *sourceEnd;
  unsigned_short *sourceStart;
  undefined1 local_21;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_20;
  _func_ConversionResult_unsigned_short_ptr_ptr_unsigned_short_ptr_uchar_ptr_ptr_uchar_ptr_ConversionFlags
  *conversionFn_local;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *vec_local;
  string *rv;
  
  local_21 = 0;
  local_20 = vec;
  conversionFn_local =
       (_func_ConversionResult_unsigned_short_ptr_ptr_unsigned_short_ptr_uchar_ptr_ptr_uchar_ptr_ConversionFlags
        *)this;
  vec_local = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)conversionFn_local);
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  puVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)conversionFn_local)
  ;
  sourceEnd = puVar2;
  sVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)conversionFn_local);
  targetStart = (UTF8 *)(puVar2 + sVar3);
  pUVar4 = (UTF8 *)std::__cxx11::string::data();
  targetEnd = pUVar4;
  targetStart_out = pUVar4;
  lVar5 = std::__cxx11::string::size();
  iVar1 = (*(code *)local_20)(&sourceEnd,targetStart,&targetEnd,pUVar4 + lVar5,0);
  if (iVar1 == 0) {
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream(local_1e0);
  std::operator<<((ostream *)local_1e0,"Cannot convert string : invalid source text");
  this_00 = (VodCoreException *)__cxa_allocate_exception(0x28);
  std::__cxx11::ostringstream::str();
  VodCoreException::VodCoreException(this_00,3,&local_200);
  __cxa_throw(this_00,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
}

Assistant:

std::string from_utf_nn(std::vector<InputType> &&vec, F conversionFn)
{
    std::string rv;
    rv.resize(vec.size() * 4);
    const InputType *sourceStart = vec.data();
    auto sourceEnd = sourceStart + vec.size();
    const auto targetStart = reinterpret_cast<UTF8 *>(rv.data());
    auto targetStart_out = targetStart;
    auto targetEnd = targetStart + rv.size();
    auto result = conversionFn(&sourceStart, sourceEnd, &targetStart_out, targetEnd, ConversionFlags::strictConversion);
    if (result != ConversionResult::conversionOK)
    {
        THROW(ERR_COMMON, "Cannot convert string : invalid source text")
    }
    rv.resize(targetStart_out - targetStart);
    return rv;
}